

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::SetTimestepperType(ChSystem *this,Type type)

{
  shared_ptr<chrono::ChTimestepper> *this_00;
  Type TVar1;
  ChException *this_01;
  __shared_ptr<chrono::ChTimestepperHHT,_(__gnu_cxx::_Lock_policy)2> local_50;
  ChSystem *local_40;
  string local_38;
  
  if (type == CUSTOM) {
    return;
  }
  TVar1 = (*((this->timestepper).
             super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChTimestepper[2])();
  if (TVar1 == type) {
    return;
  }
  if (NEWMARK < type) {
    this_01 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_38,"SetTimestepperType: timestepper not supported",
               (allocator *)&local_50);
    ChException::ChException(this_01,&local_38);
    __cxa_throw(this_01,&ChException::typeinfo,ChException::~ChException);
  }
  this_00 = &this->timestepper;
  local_40 = this;
  switch(type) {
  case EULER_IMPLICIT_LINEARIZED:
    std::make_shared<chrono::ChTimestepperEulerImplicitLinearized,chrono::ChSystem*>
              ((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperEulerImplicitLinearized,_(__gnu_cxx::_Lock_policy)2>
                *)&local_50);
    break;
  case EULER_IMPLICIT_PROJECTED:
    std::make_shared<chrono::ChTimestepperEulerImplicitProjected,chrono::ChSystem*>
              ((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperEulerImplicitProjected,_(__gnu_cxx::_Lock_policy)2>
                *)&local_50);
    break;
  case EULER_IMPLICIT:
    std::make_shared<chrono::ChTimestepperEulerImplicit,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperEulerImplicit,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::static_pointer_cast<chrono::ChTimestepperEulerImplicit,chrono::ChTimestepper>
              ((shared_ptr<chrono::ChTimestepper> *)&local_50);
    goto LAB_00a639b1;
  case TRAPEZOIDAL:
    std::make_shared<chrono::ChTimestepperTrapezoidal,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperTrapezoidal,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::static_pointer_cast<chrono::ChTimestepperTrapezoidal,chrono::ChTimestepper>
              ((shared_ptr<chrono::ChTimestepper> *)&local_50);
    goto LAB_00a639b1;
  case TRAPEZOIDAL_LINEARIZED:
    std::make_shared<chrono::ChTimestepperTrapezoidalLinearized,chrono::ChSystem*>
              ((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperTrapezoidalLinearized,_(__gnu_cxx::_Lock_policy)2>
                *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::static_pointer_cast<chrono::ChTimestepperTrapezoidalLinearized,chrono::ChTimestepper>
              ((shared_ptr<chrono::ChTimestepper> *)&local_50);
    goto LAB_00a639b1;
  case HHT:
    std::make_shared<chrono::ChTimestepperHHT,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::static_pointer_cast<chrono::ChTimestepperHHT,chrono::ChTimestepper>
              ((shared_ptr<chrono::ChTimestepper> *)&local_50);
LAB_00a639b1:
    ((local_50._M_ptr)->super_ChImplicitIterativeTimestepper).maxiters = 4;
    break;
  case HEUN:
    std::make_shared<chrono::ChTimestepperHeun,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperHeun,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    break;
  case RUNGEKUTTA45:
    std::make_shared<chrono::ChTimestepperRungeKuttaExpl,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperRungeKuttaExpl,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50);
    break;
  case EULER_EXPLICIT:
    std::make_shared<chrono::ChTimestepperEulerExplIIorder,chrono::ChSystem*>
              ((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperEulerExplIIorder,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50);
    break;
  case LEAPFROG:
    std::make_shared<chrono::ChTimestepperLeapfrog,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperLeapfrog,_(__gnu_cxx::_Lock_policy)2> *)&local_50)
    ;
    break;
  case NEWMARK:
    std::make_shared<chrono::ChTimestepperNewmark,chrono::ChSystem*>((ChSystem **)&local_50);
    std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chrono::ChTimestepperNewmark,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void ChSystem::SetTimestepperType(ChTimestepper::Type type) {
    // Do nothing if changing to a CUSTOM timestepper.
    if (type == ChTimestepper::Type::CUSTOM)
        return;

    // Do nothing, if no change from current typestepper.
    if (type == GetTimestepperType())
        return;

    // Plug in the new required timestepper
    // (the previous will be automatically deallocated thanks to shared pointers)
    switch (type) {
        case ChTimestepper::Type::EULER_IMPLICIT:
            timestepper = chrono_types::make_shared<ChTimestepperEulerImplicit>(this);
            std::static_pointer_cast<ChTimestepperEulerImplicit>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::EULER_IMPLICIT_LINEARIZED:
            timestepper = chrono_types::make_shared<ChTimestepperEulerImplicitLinearized>(this);
            break;
        case ChTimestepper::Type::EULER_IMPLICIT_PROJECTED:
            timestepper = chrono_types::make_shared<ChTimestepperEulerImplicitProjected>(this);
            break;
        case ChTimestepper::Type::TRAPEZOIDAL:
            timestepper = chrono_types::make_shared<ChTimestepperTrapezoidal>(this);
            std::static_pointer_cast<ChTimestepperTrapezoidal>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::TRAPEZOIDAL_LINEARIZED:
            timestepper = chrono_types::make_shared<ChTimestepperTrapezoidalLinearized>(this);
            std::static_pointer_cast<ChTimestepperTrapezoidalLinearized>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::HHT:
            timestepper = chrono_types::make_shared<ChTimestepperHHT>(this);
            std::static_pointer_cast<ChTimestepperHHT>(timestepper)->SetMaxiters(4);
            break;
        case ChTimestepper::Type::HEUN:
            timestepper = chrono_types::make_shared<ChTimestepperHeun>(this);
            break;
        case ChTimestepper::Type::RUNGEKUTTA45:
            timestepper = chrono_types::make_shared<ChTimestepperRungeKuttaExpl>(this);
            break;
        case ChTimestepper::Type::EULER_EXPLICIT:
            timestepper = chrono_types::make_shared<ChTimestepperEulerExplIIorder>(this);
            break;
        case ChTimestepper::Type::LEAPFROG:
            timestepper = chrono_types::make_shared<ChTimestepperLeapfrog>(this);
            break;
        case ChTimestepper::Type::NEWMARK:
            timestepper = chrono_types::make_shared<ChTimestepperNewmark>(this);
            break;
        default:
            throw ChException("SetTimestepperType: timestepper not supported");
    }
}